

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O2

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char **ppcVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char *__format;
  int iVar7;
  undefined8 uStack_e0;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string *local_c0;
  ui32_t *local_b8;
  string local_b0 [32];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->error_flag = true;
  local_b8 = &this->fb_dump_size;
  this->key_flag = false;
  this->read_hmac = false;
  this->split_wav = false;
  this->mono_wav = false;
  this->verbose_flag = false;
  this->fb_dump_size = 0;
  *(undefined4 *)((long)&this->fb_dump_size + 3) = 0;
  this->number_width = 6;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->duration_flag = false;
  this->j2c_pedantic = true;
  this->picture_rate = 0x18;
  this->fb_size = 0x400000;
  ppcVar1 = &this->input_filename;
  local_c0 = (string *)&this->prefix_buffer;
  (this->edit_rate).Numerator = 0;
  (this->edit_rate).Denominator = 0;
  this->file_prefix = (char *)0x0;
  this->input_filename = (char *)0x0;
  this->extension = (char *)0x0;
  this->g_stream_sid = 0;
  (this->prefix_buffer)._M_dataplus._M_p = (pointer)&(this->prefix_buffer).field_2;
  (this->prefix_buffer)._M_string_length = 0;
  (this->prefix_buffer).field_2._M_local_buf[0] = '\0';
  this->key_id_value[0] = '\0';
  this->key_id_value[1] = '\0';
  this->key_id_value[2] = '\0';
  this->key_id_value[3] = '\0';
  this->key_id_value[4] = '\0';
  this->key_id_value[5] = '\0';
  this->key_id_value[6] = '\0';
  this->key_id_value[7] = '\0';
  this->key_id_value[8] = '\0';
  this->key_id_value[9] = '\0';
  this->key_id_value[10] = '\0';
  this->key_id_value[0xb] = '\0';
  this->key_id_value[0xc] = '\0';
  this->key_id_value[0xd] = '\0';
  this->key_id_value[0xe] = '\0';
  this->key_id_value[0xf] = '\0';
  this->key_value[0] = '\0';
  this->key_value[1] = '\0';
  this->key_value[2] = '\0';
  this->key_value[3] = '\0';
  this->key_value[4] = '\0';
  this->key_value[5] = '\0';
  this->key_value[6] = '\0';
  this->key_value[7] = '\0';
  this->key_value[8] = '\0';
  this->key_value[9] = '\0';
  this->key_value[10] = '\0';
  this->key_value[0xb] = '\0';
  this->key_value[0xc] = '\0';
  this->key_value[0xd] = '\0';
  this->key_value[0xe] = '\0';
  this->key_value[0xf] = '\0';
  iVar7 = 1;
  do {
    if (argc <= iVar7) {
      if ((this->help_flag == false) && (this->version_flag == false)) {
        if (*ppcVar1 == (char *)0x0) {
          fputs("At least one filename argument is required.\n",_stderr);
          return;
        }
        if (this->file_prefix == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>(local_90,*ppcVar1,&local_c1);
          std::__cxx11::string::string<std::allocator<char>>(local_b0,"",&local_c2);
          Kumu::PathSetExtension((string *)&local_70,local_90);
          std::operator+(&local_50,&local_70,"_");
          std::__cxx11::string::operator=(local_c0,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string(local_b0);
          std::__cxx11::string::~string(local_90);
          this->file_prefix = (this->prefix_buffer)._M_dataplus._M_p;
        }
        this->error_flag = false;
      }
      return;
    }
    pcVar3 = argv[iVar7];
    iVar4 = strcmp(pcVar3,"-help");
    if (iVar4 == 0) {
      this->help_flag = true;
    }
    else if (*pcVar3 == '-') {
      cVar2 = pcVar3[1];
      iVar4 = isalpha((int)cVar2);
      if ((9 < (int)cVar2 - 0x30U && iVar4 == 0) || (pcVar3[2] != '\0')) {
        __format = "Unrecognized argument: %s\n";
        goto LAB_0010bb42;
      }
      switch(cVar2) {
      case 'V':
        this->version_flag = true;
        break;
      case 'W':
        this->no_write_flag = true;
        break;
      case 'X':
      case 'Y':
      case '[':
      case '\\':
      case ']':
      case '^':
      case '_':
      case '`':
      case 'a':
      case 'c':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'n':
      case 'o':
      case 'q':
      case 'r':
      case 't':
      case 'u':
      case 'x':
      case 'y':
switchD_0010b7d6_caseD_58:
        __format = "Unrecognized option: %s\n";
LAB_0010bb42:
        fprintf(_stderr,__format,pcVar3);
        return;
      case 'Z':
        this->j2c_pedantic = false;
        break;
      case 'b':
        iVar7 = iVar7 + 1;
        if ((argc <= iVar7) || (*argv[iVar7] == '-')) {
          uStack_e0 = 0x62;
LAB_0010bc2d:
          fprintf(_stderr,"Argument not found for option -%c.\n",uStack_e0);
          return;
        }
        lVar6 = strtol(argv[iVar7],(char **)0x0,10);
        lVar5 = -lVar6;
        if (0 < lVar6) {
          lVar5 = lVar6;
        }
        this->fb_size = (ui32_t)lVar5;
        if (this->verbose_flag == true) {
          fprintf(_stderr,"Frame Buffer size: %u bytes.\n");
        }
        break;
      case 'd':
        iVar7 = iVar7 + 1;
        if ((argc <= iVar7) || (pcVar3 = argv[iVar7], *pcVar3 == '-')) {
          uStack_e0 = 100;
          goto LAB_0010bc2d;
        }
        this->duration_flag = true;
        lVar6 = strtol(pcVar3,(char **)0x0,10);
        lVar5 = -lVar6;
        if (0 < lVar6) {
          lVar5 = lVar6;
        }
        this->duration = (ui32_t)lVar5;
        break;
      case 'e':
        iVar7 = iVar7 + 1;
        if ((argc <= iVar7) || (*argv[iVar7] == '-')) {
          uStack_e0 = 0x65;
          goto LAB_0010bc2d;
        }
        this->extension = argv[iVar7];
        break;
      case 'f':
        iVar7 = iVar7 + 1;
        if ((argc <= iVar7) || (*argv[iVar7] == '-')) {
          uStack_e0 = 0x66;
          goto LAB_0010bc2d;
        }
        lVar6 = strtol(argv[iVar7],(char **)0x0,10);
        lVar5 = -lVar6;
        if (0 < lVar6) {
          lVar5 = lVar6;
        }
        this->start_frame = (ui32_t)lVar5;
        break;
      case 'g':
        iVar7 = iVar7 + 1;
        if ((argc <= iVar7) || (*argv[iVar7] == '-')) {
          uStack_e0 = 0x67;
          goto LAB_0010bc2d;
        }
        lVar5 = strtol(argv[iVar7],(char **)0x0,10);
        this->g_stream_sid = (i32_t)lVar5;
        break;
      case 'h':
        this->help_flag = true;
        break;
      case 'm':
        this->read_hmac = true;
        break;
      case 'p':
        iVar7 = iVar7 + 1;
        if ((argc <= iVar7) || (*argv[iVar7] == '-')) {
          uStack_e0 = 0x70;
          goto LAB_0010bc2d;
        }
        lVar6 = strtol(argv[iVar7],(char **)0x0,10);
        lVar5 = -lVar6;
        if (0 < lVar6) {
          lVar5 = lVar6;
        }
        this->picture_rate = (ui32_t)lVar5;
        break;
      case 's':
        iVar7 = iVar7 + 1;
        if ((argc <= iVar7) || (*argv[iVar7] == '-')) {
          uStack_e0 = 0x73;
          goto LAB_0010bc2d;
        }
        lVar6 = strtol(argv[iVar7],(char **)0x0,10);
        lVar5 = -lVar6;
        if (0 < lVar6) {
          lVar5 = lVar6;
        }
        *local_b8 = (ui32_t)lVar5;
        break;
      case 'v':
        this->verbose_flag = true;
        break;
      case 'w':
        iVar7 = iVar7 + 1;
        if ((argc <= iVar7) || (*argv[iVar7] == '-')) {
          uStack_e0 = 0x77;
          goto LAB_0010bc2d;
        }
        lVar6 = strtol(argv[iVar7],(char **)0x0,10);
        lVar5 = -lVar6;
        if (0 < lVar6) {
          lVar5 = lVar6;
        }
        this->number_width = (ui32_t)lVar5;
        break;
      case 'z':
        this->j2c_pedantic = true;
        break;
      default:
        if (cVar2 == '2') {
          this->split_wav = true;
        }
        else {
          if (cVar2 != '1') goto switchD_0010b7d6_caseD_58;
          this->mono_wav = true;
        }
      }
    }
    else if (*ppcVar1 == (char *)0x0) {
      *ppcVar1 = pcVar3;
    }
    else if (this->file_prefix == (char *)0x0) {
      this->file_prefix = pcVar3;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), key_flag(false), read_hmac(false), split_wav(false),
    mono_wav(false), verbose_flag(false), fb_dump_size(0), no_write_flag(false),
    version_flag(false), help_flag(false), number_width(6),
    start_frame(0), duration(0xffffffff), duration_flag(false), j2c_pedantic(true),
    picture_rate(24), fb_size(FRAME_BUFFER_SIZE), file_prefix(0),
    input_filename(0), extension(0), g_stream_sid(0)
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);

    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }
         
	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '1': mono_wav = true; break;
	      case '2': split_wav = true; break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));

		if ( verbose_flag )
		  fprintf(stderr, "Frame Buffer size: %u bytes.\n", fb_size);

		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration_flag = true;
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'e':
		TEST_EXTRA_ARG(i, 'e');
		extension = argv[i];
		break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'g':
		TEST_EXTRA_ARG(i, 'g');
		g_stream_sid = strtol(argv[i], 0, 10);
		break;
		  
	      case 'h': help_flag = true; break;
	      case 'm': read_hmac = true; break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		fb_dump_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'W': no_write_flag = true; break;

	      case 'w':
		TEST_EXTRA_ARG(i, 'w');
		number_width = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		if ( input_filename == 0 )
		  {
		    input_filename = argv[i];
		  }
		else if ( file_prefix == 0 )
		  {
		    file_prefix = argv[i];
		  }
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;
    
    if ( input_filename == 0 )
      {
	fputs("At least one filename argument is required.\n", stderr);
	return;
      }

    if ( file_prefix == 0 )
      {
	prefix_buffer = Kumu::PathSetExtension(input_filename, "") + "_";
	file_prefix = prefix_buffer.c_str();
      }

    error_flag = false;
  }